

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

void __thiscall sophia_interface::LUEDIT(sophia_interface *this,int MEDIT)

{
  double dVar1;
  int IZ;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int (*paiVar5) [4000];
  double (*padVar6) [4000];
  int iVar7;
  int iVar8;
  undefined4 in_register_00000034;
  long lVar9;
  int *piVar10;
  sophia_interface *psVar11;
  int I_3;
  uint uVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  int I;
  int iVar16;
  int I_2;
  long lVar17;
  int *piVar18;
  double *pdVar19;
  ulong uVar20;
  ulong uVar21;
  int I_1;
  int iVar22;
  long lVar23;
  double (*padVar24) [4000];
  double dVar25;
  undefined1 local_a8 [40];
  double PTS [2];
  double PLS [2];
  int local_60 [2];
  int NS [2];
  allocator local_45;
  uint local_44;
  double local_40;
  sophia_interface *local_38;
  
  local_40 = (double)CONCAT44(in_register_00000034,MEDIT);
  uVar12 = 1;
  local_38 = this;
  if (((uint)MEDIT < 6) && (MEDIT != 4)) {
    iVar22 = MSTU[1];
    if (MSTU[1] < 1) {
      iVar22 = this->N;
    }
    uVar3 = 1;
    if (1 < MSTU[0]) {
      uVar3 = (ulong)(uint)MSTU[0];
    }
    uVar12 = (int)uVar3 - 1;
    lVar23 = (long)(this->K + -1) + 0x3e7c + uVar3 * 4;
    NS = (int  [2])this->K;
    pdVar19 = this->V[-1] + uVar3 + 3999;
    local_40 = (double)(ulong)(MEDIT - 1);
    psVar11 = this;
    for (lVar17 = uVar3 - 1; lVar17 < iVar22; lVar17 = lVar17 + 1) {
      iVar7 = local_38->K[0][lVar17];
      if (0x14 < iVar7 || iVar7 == 0) goto LAB_0010d9d1;
      if (local_40._0_4_ < 5) {
        switch((long)&switchD_0010d873::switchdataD_00129694 +
               (long)(int)(&switchD_0010d873::switchdataD_00129694)[(long)local_40]) {
        case 0x10d875:
          if (iVar7 < 0xb) goto switchD_0010d873_caseD_10d975;
          break;
        case 0x10d883:
          if (iVar7 < 0xb) {
            local_44 = local_38->K[1][lVar17];
            iVar7 = LUCOMP(psVar11,local_44);
            if (iVar7 != 0) {
              if (KCHG[0][(long)iVar7 + 499] == 0) {
                iVar7 = LUCHGE(psVar11,local_44);
                goto joined_r0x0010d973;
              }
              goto switchD_0010d873_caseD_10d975;
            }
          }
          break;
        case 0x10d8eb:
          if (iVar7 < 0xb) {
            uVar2 = LUCOMP(psVar11,local_38->K[1][lVar17]);
            if ((9 < (uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f)) ||
               ((0x3c1U >> (uVar2 >> 1 & 0x1f) & 1) == 0)) goto switchD_0010d873_caseD_10d975;
          }
          break;
        case 0x10d929:
          if ((1 < iVar7 - 0xdU) &&
             (local_44 = uVar12, iVar8 = LUCOMP(psVar11,local_38->K[1][lVar17]), uVar12 = local_44,
             iVar8 != 0)) {
            if (10 < iVar7) {
              iVar7 = KCHG[0][(long)iVar8 + 499];
joined_r0x0010d973:
              if (iVar7 == 0) break;
            }
            goto switchD_0010d873_caseD_10d975;
          }
          break;
        case 0x10d975:
          goto switchD_0010d873_caseD_10d975;
        }
      }
      else {
switchD_0010d873_caseD_10d975:
        uVar3 = (ulong)uVar12;
        for (lVar9 = 0; lVar9 != 80000; lVar9 = lVar9 + 16000) {
          psVar11 = (sophia_interface *)(ulong)*(uint *)(lVar23 + lVar9);
          *(uint *)((long)NS + uVar3 * 4 + lVar9) = *(uint *)(lVar23 + lVar9);
          *(undefined8 *)((long)this->P[0] + lVar9 * 2 + uVar3 * 8) =
               *(undefined8 *)((long)pdVar19 + lVar9 * 2 + -160000);
          *(undefined8 *)((long)this->V[0] + lVar9 * 2 + uVar3 * 8) =
               *(undefined8 *)((long)pdVar19 + lVar9 * 2);
        }
        local_38->K[2][uVar3] = 0;
        uVar12 = uVar12 + 1;
      }
LAB_0010d9d1:
      lVar23 = lVar23 + 4;
      pdVar19 = pdVar19 + 1;
    }
    iVar22 = local_38->N;
    if ((int)uVar12 < iVar22) {
      MSTU[2] = 0;
      iVar22 = local_38->N;
    }
    if ((int)uVar12 < iVar22) {
      MSTU[0x45] = 0;
    }
    local_38->N = uVar12;
  }
  else {
    if (MEDIT - 0xbU < 5) {
      uVar12 = this->N;
      paiVar5 = this->K;
      uVar3 = 0;
      uVar20 = 0;
      if (0 < (int)uVar12) {
        uVar20 = (ulong)uVar12;
      }
      iVar22 = 0;
      do {
        if (uVar20 == uVar3) {
          uVar3 = 1;
          do {
            iVar22 = MSTU[0x59];
            if (uVar3 == (int)uVar20 + 1) {
              MSTU[0x59] = 0;
              padVar6 = this->V;
              uVar20 = 0;
              uVar3 = (ulong)(uint)iVar22;
              if (iVar22 < 1) {
                uVar3 = uVar20;
              }
              uVar4 = 0;
              padVar24 = padVar6;
              do {
                iVar22 = this->N;
                lVar17 = 0;
                uVar21 = uVar20;
                while( true ) {
                  iVar7 = (int)uVar4;
                  if ((long)iVar22 <= (long)uVar21) {
                    if (iVar7 < iVar22) {
                      MSTU[2] = 0;
                      iVar22 = this->N;
                    }
                    if (iVar7 < iVar22) {
                      MSTU[0x45] = 0;
                    }
                    this->N = iVar7;
                    return;
                  }
                  if (this->K[2][uVar21] / MSTU[4] != 0) break;
                  uVar21 = uVar21 + 1;
                  lVar17 = lVar17 + 4;
                }
                for (lVar23 = -80000; lVar23 != 0; lVar23 = lVar23 + 16000) {
                  *(undefined4 *)((long)(paiVar5 + 5) + lVar23) =
                       *(undefined4 *)((long)this->K[0] + lVar17 + uVar20 * 4);
                  *(undefined8 *)((long)*padVar24 + lVar23 * 2) =
                       *(undefined8 *)((long)padVar6[-5] + lVar17 * 2 + uVar20 * 8);
                  *(undefined8 *)((long)(padVar24 + 5) + lVar23 * 2) =
                       *(undefined8 *)((long)*padVar6 + lVar17 * 2 + uVar20 * 8);
                  lVar17 = lVar17 + 16000;
                }
                this->K[2][uVar4] = this->K[2][uVar4] % MSTU[4];
                uVar20 = uVar21 + 1;
                for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
                  if (uVar20 == (uint)MSTU[uVar4 + 0x5a]) {
                    lVar17 = (long)MSTU[0x59];
                    MSTU[0x59] = MSTU[0x59] + 1;
                    MSTU[lVar17 + 0x5a] = iVar7 + 1U;
                    PARU[(long)MSTU[0x59] + 0x59] = PARU[uVar4 + 0x5a];
                  }
                }
                paiVar5 = (int (*) [4000])(*paiVar5 + 1);
                padVar24 = (double (*) [4000])(*padVar24 + 1);
                uVar4 = (ulong)(iVar7 + 1U);
              } while( true );
            }
            uVar2 = *(uint *)((long)(this->K + -1) + 0x3e7c + uVar3 * 4);
            if (0xffffffeb < uVar2 - 0x15) {
              iVar22 = this->K[1][uVar3 + 3999];
              if (iVar22 / MSTU[4] != 0) {
                uVar4 = uVar3 & 0xffffffff;
                do {
                  while( true ) {
                    uVar21 = (long)this->K[1][(long)(int)uVar4 + 3999] % (long)MSTU[4];
                    uVar4 = uVar21 & 0xffffffff;
                    iVar7 = (int)uVar21;
                    if (iVar7 <= (int)uVar12 && (0 < iVar7 && MEDIT == 0xd)) break;
                    if ((((MEDIT != 0xe) || (iVar7 < 1)) || ((int)uVar12 < iVar7)) ||
                       ((1 < (*paiVar5)[iVar7 - 1U] - 0xdU && (this->K[1][iVar7 - 1U] != 0x5e))))
                    goto LAB_0010de05;
                  }
                } while (((uint)(*paiVar5)[iVar7 - 1U] < 0x10) &&
                        (((0x9800U >> ((*paiVar5)[iVar7 - 1U] & 0x1fU) & 1) != 0 &&
                         (this->K[1][iVar7 - 1U] != 0x5e))));
LAB_0010de05:
                iVar22 = iVar22 - iVar22 % MSTU[4];
                this->K[1][uVar3 + 3999] = iVar22;
                if (iVar7 != 0) {
                  this->K[1][uVar3 + 3999] = this->K[1][(long)iVar7 + 3999] / MSTU[4] + iVar22;
                }
                if ((uVar2 < 0xf) && ((0x6008U >> (uVar2 & 0x1f) & 1) != 0)) {
                  iVar22 = this->K[2][uVar3 + 3999];
                  iVar8 = iVar22 % MSTU[4];
                  iVar7 = (int)((long)((ulong)(uint)((int)((long)iVar22 / (long)MSTU[4]) >> 0x1f) <<
                                       0x20 | (long)iVar22 / (long)MSTU[4] & 0xffffffffU) %
                               (long)MSTU[4]);
                  if (iVar7 <= MSTU[3] && 0 < iVar7) {
                    iVar7 = this->K[2][iVar7 - 1] / MSTU[4];
                  }
                  if (iVar8 <= MSTU[3] && 0 < iVar8) {
                    iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
                  }
                  this->K[2][uVar3 + 3999] =
                       (iVar22 + iVar8 + iVar7 * MSTU[4]) - iVar22 % (MSTU[4] * MSTU[4]);
                  iVar22 = this->K[3][uVar3 + 3999];
                  iVar8 = iVar22 % MSTU[4];
                  iVar7 = (int)((long)((ulong)(uint)((int)((long)iVar22 / (long)MSTU[4]) >> 0x1f) <<
                                       0x20 | (long)iVar22 / (long)MSTU[4] & 0xffffffffU) %
                               (long)MSTU[4]);
                  if (iVar7 <= MSTU[3] && 0 < iVar7) {
                    iVar7 = this->K[2][iVar7 - 1] / MSTU[4];
                  }
                  if (iVar8 <= MSTU[3] && 0 < iVar8) {
                    iVar8 = this->K[2][iVar8 - 1] / MSTU[4];
                  }
                  this->K[3][uVar3 + 3999] =
                       (iVar22 + iVar8 + iVar7 * MSTU[4]) - iVar22 % (MSTU[4] * MSTU[4]);
                }
                else {
                  iVar22 = this->K[2][uVar3 + 3999];
                  if (iVar22 <= MSTU[3] && 0 < iVar22) {
                    this->K[2][uVar3 + 3999] = this->K[2][iVar22 - 1] / MSTU[4];
                  }
                  iVar22 = this->K[3][uVar3 + 3999];
                  if ((0 < iVar22) && (iVar22 <= MSTU[3])) {
                    this->K[3][uVar3 + 3999] = this->K[2][iVar22 - 1] / MSTU[4];
                  }
                }
              }
            }
            uVar3 = uVar3 + 1;
          } while( true );
        }
        iVar7 = this->K[2][uVar3] % MSTU[4];
        this->K[2][uVar3] = iVar7;
        switch(MEDIT - 0xbU) {
        case 0:
          if (-1 < this->K[0][uVar3]) break;
          goto LAB_0010daf9;
        case 1:
          if (this->K[0][uVar3] == 0) goto LAB_0010daf9;
          break;
        case 2:
          uVar2 = this->K[0][uVar3];
          if ((uVar2 < 0x10) &&
             (((0x9800U >> (uVar2 & 0x1f) & 1) != 0 && (this->K[1][uVar3] != 0x5e))))
          goto LAB_0010daf9;
          break;
        case 3:
          if ((this->K[0][uVar3] - 0xdU < 2) || (this->K[1][uVar3] == 0x5e)) goto LAB_0010daf9;
          break;
        case 4:
          if (0x14 < this->K[0][uVar3]) goto LAB_0010daf9;
        }
        iVar22 = iVar22 + 1;
        this->K[2][uVar3] = MSTU[4] * iVar22 + iVar7;
LAB_0010daf9:
        uVar3 = uVar3 + 1;
      } while( true );
    }
    switch(MEDIT) {
    case 0x10:
      for (; iVar22 = this->N, (int)uVar12 <= iVar22; uVar12 = uVar12 + 1) {
        lVar17 = (long)(int)uVar12;
        if (((0xfffffff5 < *(int *)((long)(this->K + -1) + 0x3e7c + lVar17 * 4) - 0x15U) &&
            (this->K[2][lVar17 + 3999] == 0)) && (this->K[3][lVar17 + 3999] == 0)) {
          piVar18 = this->K[2] + lVar17 + 3999;
          piVar10 = this->K[3] + lVar17 + 3999;
          uVar3 = 0;
          uVar21 = 0;
          uVar4 = (ulong)(int)(uVar12 + 1);
          for (uVar20 = uVar4; iVar7 = (int)uVar21, (long)uVar20 <= (long)iVar22;
              uVar20 = uVar20 + 1) {
            if (this->K[1][uVar20 + 3999] == uVar12) {
              piVar13 = piVar10;
              if (iVar7 == 0) {
                piVar13 = piVar18;
              }
              if (iVar7 == 0) {
                uVar21 = uVar20 & 0xffffffff;
              }
              else {
                uVar3 = uVar20 & 0xffffffff;
              }
              *piVar13 = (int)uVar20;
            }
            iVar22 = this->N;
          }
          if ((int)uVar3 == 0) {
            *piVar10 = iVar7;
            uVar3 = uVar21;
          }
          if (iVar7 == 0) {
            iVar22 = this->K[1][lVar17 + 3999];
            if (((0 < (long)iVar22) && (iVar22 < (int)uVar12)) &&
               ((uVar2 = iVar22 - 1, 0xfffffff5 < this->K[0][uVar2] - 0x1fU &&
                ((this->K[1][uVar2] == this->K[0][lVar17 + 3999] &&
                 (ABS(this->P[4][uVar2] - this->P[3][lVar17 + 3999]) <= 0.01)))))) {
              uVar20 = 0;
              for (; iVar7 = (int)uVar20, (long)uVar4 <= (long)this->N; uVar4 = uVar4 + 1) {
                if (this->K[1][uVar4 + 3999] == iVar22) {
                  piVar13 = piVar10;
                  if (iVar7 == 0) {
                    piVar13 = piVar18;
                  }
                  if (iVar7 == 0) {
                    uVar20 = uVar4 & 0xffffffff;
                  }
                  else {
                    uVar3 = uVar4 & 0xffffffff;
                  }
                  *piVar13 = (int)uVar4;
                }
              }
              if ((int)uVar3 == 0) {
                *piVar10 = iVar7;
              }
              lVar23 = (long)iVar22;
              iVar8 = iVar22;
              iVar16 = iVar22;
              if (iVar7 == 0) {
                while( true ) {
                  lVar9 = lVar23;
                  lVar23 = lVar9 + 1;
                  iVar7 = (int)lVar23;
                  if ((int)uVar12 <= iVar7) break;
                  if (((this->K[2][lVar9] == iVar22) && (this->K[0][lVar9] - 0x15U < 10)) &&
                     (iVar16 = iVar7, iVar8 == iVar22)) {
                    iVar8 = iVar7;
                  }
                }
                piVar18 = this->K[2] + lVar17 + 3999;
                lVar17 = (lVar17 << 0x20) + -0x100000000;
                uVar2 = uVar12;
                while ((int)uVar12 < this->N) {
                  iVar22 = this->K[2][uVar12];
                  if ((iVar22 == iVar8) || (iVar22 == iVar16)) {
                    piVar10 = piVar18 + 4000;
                    if (*piVar18 == 0) {
                      piVar10 = piVar18;
                    }
                    *piVar10 = uVar12 + 1;
                  }
                  lVar17 = lVar17 + 0x100000000;
                  uVar2 = uVar2 + 1;
                  piVar18 = piVar18 + 1;
                }
                uVar12 = uVar2;
                if (*(int *)((long)this->K[4] + (lVar17 >> 0x1e)) == 0) {
                  this->K[4][lVar17 >> 0x20] = this->K[3][lVar17 >> 0x20];
                }
              }
            }
          }
        }
      }
      break;
    default:
      if (MEDIT - 0x1fU < 2) {
        iVar22 = MSTU[2] + this->N;
        dVar25 = ULANGL(this,*(double *)((long)(this->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4)
                        ,this->P[0][(long)MSTU[0x3c] + 3999]);
        psVar11 = local_38;
        LUDBRB(local_38,1,iVar22,0.0,-dVar25,0.0,0.0,0.0,false);
        iVar22 = MSTU[2] + local_38->N;
        dVar25 = ULANGL(psVar11,local_38->P[1][(long)MSTU[0x3c] + 3999],
                        *(double *)((long)(local_38->P + -1) + ((long)MSTU[0x3c] * 2 + 0x1f3e) * 4))
        ;
        psVar11 = local_38;
        LUDBRB(local_38,1,iVar22,-dVar25,0.0,0.0,0.0,0.0,false);
        iVar22 = MSTU[2] + local_38->N;
        dVar25 = local_38->P[0][MSTU[0x3c]];
        dVar25 = ULANGL(psVar11,dVar25,dVar25);
        psVar11 = local_38;
        LUDBRB(local_38,1,iVar22,0.0,-dVar25,0.0,0.0,0.0,false);
        if (MEDIT != 0x1f) {
          for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
            local_60[lVar17] = 0;
            PTS[lVar17 + -1] = 0.0;
            PTS[lVar17 + 1] = 0.0;
          }
          for (lVar17 = 0; iVar22 = MSTU[0x28], lVar17 < local_38->N; lVar17 = lVar17 + 1) {
            if (0xfffffff5 < local_38->K[0][lVar17] - 0xbU) {
              if (1 < MSTU[0x28]) {
                iVar7 = local_38->K[1][lVar17];
                uVar12 = LUCOMP(psVar11,iVar7);
                if ((((uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f) < 10) &&
                    ((0x3c1U >> (uVar12 >> 1 & 0x1f) & 1) != 0)) ||
                   ((iVar22 != 2 &&
                    ((KCHG[0][(long)(int)uVar12 + 499] == 0 &&
                     (iVar22 = LUCHGE(psVar11,iVar7), iVar22 == 0)))))) goto LAB_0010e50f;
              }
              pdVar19 = local_38->P[2] + lVar17;
              uVar3 = (ulong)(*pdVar19 <= 0.0 && *pdVar19 != 0.0);
              local_60[uVar3] = local_60[uVar3] + 1;
              dVar25 = local_38->P[0][lVar17];
              dVar1 = local_38->P[1][lVar17];
              PTS[uVar3 - 1] = SQRT(dVar25 * dVar25 + dVar1 * dVar1) + PTS[uVar3 - 1];
            }
LAB_0010e50f:
          }
          if ((double)local_60[0] * PTS[0] * PTS[0] <
              (double)local_60[1] * (double)local_a8._32_8_ * (double)local_a8._32_8_) {
            LUDBRB(local_38,1,local_38->N + MSTU[2],PARU[0],0.0,0.0,0.0,0.0,false);
          }
          for (lVar17 = 0; iVar22 = MSTU[0x28], lVar17 < local_38->N; lVar17 = lVar17 + 1) {
            dVar25 = local_38->P[2][lVar17];
            if ((dVar25 < 0.0) && (0xfffffff5 < local_38->K[0][lVar17] - 0xbU)) {
              if (1 < MSTU[0x28]) {
                iVar7 = local_38->K[1][lVar17];
                psVar11 = local_38;
                local_40 = dVar25;
                uVar12 = LUCOMP(local_38,iVar7);
                if (((uVar12 >> 1 | (uint)((uVar12 & 1) != 0) << 0x1f) < 10) &&
                   ((0x3c1U >> (uVar12 >> 1 & 0x1f) & 1) != 0)) goto LAB_0010e648;
                dVar25 = local_40;
                if ((iVar22 != 2) && (KCHG[0][(long)(int)uVar12 + 499] == 0)) {
                  iVar22 = LUCHGE(psVar11,iVar7);
                  if (iVar22 == 0) goto LAB_0010e648;
                  dVar25 = local_38->P[2][lVar17];
                }
              }
              pdVar19 = local_38->P[0] + lVar17;
              uVar3 = (ulong)(*pdVar19 <= 0.0 && *pdVar19 != 0.0);
              PTS[uVar3 + 1] = PTS[uVar3 + 1] - dVar25;
            }
LAB_0010e648:
          }
          if (PTS[1] < PLS[0]) {
            LUDBRB(local_38,1,local_38->N + MSTU[2],0.0,PARU[0],0.0,0.0,0.0,false);
            return;
          }
        }
      }
      break;
    case 0x15:
      iVar22 = this->N;
      uVar3 = (ulong)(uint)MSTU[3];
      if (iVar22 * 2 < MSTU[3]) {
        lVar17 = 0x1d4c4;
        lVar23 = 0;
        for (lVar9 = 0; MSTU[0x1f] = iVar22, lVar9 < iVar22; lVar9 = lVar9 + 1) {
          lVar14 = lVar17;
          for (lVar15 = 0x9c44; lVar15 != 0x1d4c4; lVar15 = lVar15 + 16000) {
            *(undefined4 *)((long)this + lVar15 + -40000 + ((int)uVar3 + lVar23) * 4) =
                 *(undefined4 *)((long)this + lVar14 + -120000);
            uVar3 = (ulong)MSTU[3];
            *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar15 * 2 + (uVar3 + lVar23) * 8) =
                 *(undefined8 *)((long)this + lVar14 * 2 + -160000);
            *(undefined8 *)((long)this->P[2] + lVar15 * 2 + (uVar3 + lVar23) * 8 + 0x3e78) =
                 *(undefined8 *)((long)(this->K + -1) + 0x3e7c + lVar14 * 2);
            lVar14 = lVar14 + 16000;
          }
          iVar22 = this->N;
          lVar17 = lVar17 + 4;
          lVar23 = lVar23 + -1;
        }
      }
      else {
        psVar11 = (sophia_interface *)local_a8;
        std::__cxx11::string::string
                  ((string *)local_a8,"(LUEDIT:) no more memory left in LUJETS",&local_45);
        LUERRM(psVar11,0xb,(string *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
      }
      break;
    case 0x16:
      paiVar5 = this->K;
      padVar6 = this->P;
      lVar17 = 0;
      for (lVar23 = 0; lVar23 < MSTU[0x1f]; lVar23 = lVar23 + 1) {
        for (lVar9 = 0; lVar9 != 80000; lVar9 = lVar9 + 16000) {
          *(undefined4 *)((long)*paiVar5 + lVar9) =
               *(undefined4 *)((long)this->K[0] + lVar9 + (MSTU[3] + lVar17) * 4);
          lVar14 = (long)MSTU[3];
          *(undefined8 *)((long)*padVar6 + lVar9 * 2) =
               *(undefined8 *)((long)this->P[0] + lVar9 * 2 + (lVar14 + lVar17) * 8);
          *(undefined8 *)((long)padVar6[5] + lVar9 * 2) =
               *(undefined8 *)((long)this->V[0] + lVar9 * 2 + (lVar14 + lVar17) * 8);
        }
        lVar17 = lVar17 + -1;
        paiVar5 = (int (*) [4000])(*paiVar5 + 1);
        padVar6 = (double (*) [4000])(*padVar6 + 1);
      }
      this->N = MSTU[0x1f];
      break;
    case 0x17:
      uVar20 = 0;
      uVar3 = (ulong)(uint)this->N;
      if (this->N < 1) {
        uVar3 = uVar20;
      }
      for (; uVar3 != uVar20; uVar20 = uVar20 + 1) {
        iVar22 = this->K[2][uVar20];
        if (iVar22 < 1) {
          if (iVar22 != 0) goto LAB_0010e43e;
        }
        else if (this->K[0][iVar22 - 1] < 0x15) {
LAB_0010e43e:
          uVar3 = uVar20 & 0xffffffff;
          break;
        }
        iVar22 = this->K[0][uVar20];
        if (iVar22 - 0xbU < 10) {
          this->K[0][uVar20] = iVar22 + -10;
        }
      }
      this->N = (int)uVar3;
    }
  }
  return;
}

Assistant:

void sophia_interface::LUEDIT(int MEDIT) {
// Purpose: to perform global manipulations on the event record,
// in particular to exclude unstable or undetectable partons/particles.
    int NS[2];
    double PTS[2];
    double PLS[2];

    // Remove unwanted partons/particles.
    if ((MEDIT >= 0 && MEDIT <= 3) || MEDIT == 5) {
        int IMAX = N;
        if (MSTU[1] > 0) IMAX = MSTU[1];
        int I1 = std::max(1, MSTU[0]) - 1;
        for (int I = std::max(1, MSTU[0]) - 1; I < IMAX; ++I) {
            if (K[0][I] == 0 || K[0][I] > 20) continue;
            if (MEDIT == 1) {
                if (K[0][I] > 10) continue;
            } else if (MEDIT == 2) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
            } else if (MEDIT == 3) {
                if (K[0][I] > 10) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
            } else if (MEDIT == 5) {
                if (K[0][I] == 13 || K[0][I] == 14) continue;
                int KC = LUCOMP(K[1][I]);
                if (KC == 0) continue;
                if (K[0][I] >= 11 && KCHG[1][KC - 1] == 0) continue;
            }

            // Pack remaining partons/particles. Origin no longer known.
            I1++;
            for (int J = 0; J < 5; ++J) {
                K[J][I1 - 1] = K[J][I];
                P[J][I1 - 1] = P[J][I];
                V[J][I1 - 1] = V[J][I];
            }
            K[2][I1 - 1] = 0;
        } 
        if (I1 < N) MSTU[2] = 0;
        if (I1 < N) MSTU[69] = 0;
        N = I1;
 
        // Selective removal of class of entries. New position of retained. 
        } else if (MEDIT >= 11 && MEDIT <= 15) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                K[2][I] = K[2][I] % MSTU[4];
                if (MEDIT == 11 && K[0][I] < 0) continue;
                if (MEDIT == 12 && K[0][I] == 0) continue;
                if (MEDIT == 13 && (K[0][I] == 11 || K[0][I] == 12 || K[0][I] == 15) && K[1][I] != 94) continue;
                if (MEDIT == 14 && (K[0][I] == 13 || K[0][I] == 14 || K[1][I] == 94)) continue;
                if (MEDIT == 15 && K[0][I] >= 21) continue;
                I1++;
                K[2][I] = K[2][I] + MSTU[4] * I1;
            }

            // Find new event history information and replace old.
            for (int I = 1; I < N + 1; ++I) { 
                if (K[0][I - 1] <= 0 || K[0][I - 1] > 20 || K[2][I - 1] / MSTU[4] == 0) continue;
                int ID = I;
                int IM = 0;
                bool repeat130 = false;
                do {
                    repeat130 = false;
                    IM = K[2][ID - 1] % MSTU[4];
                    if (MEDIT == 13 && IM > 0 && IM <= N) {
                        if ((K[0][IM - 1] == 11 || K[0][IM - 1] == 12 || K[0][IM - 1] == 15) && K[1][IM - 1] != 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    } else if (MEDIT == 14 && IM > 0 && IM <= N) {
                        if (K[0][IM - 1] == 13 || K[0][IM - 1] == 14 || K[1][IM - 1] == 94) {
                            ID = IM;
                            repeat130 = true;
                            continue;
                        }
                    }
                } while (repeat130);

                K[2][I - 1] = MSTU[4] * (K[2][I - 1] / MSTU[4]);
                if (IM != 0) K[2][I - 1] += K[2][IM - 1] / MSTU[4];
                if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) {
                    if (K[3][I - 1] > 0 && K[3][I - 1] <= MSTU[3]) K[3][I - 1] = K[2][K[3][I - 1] - 1] / MSTU[4];
                    if (K[4][I - 1] > 0 && K[4][I - 1] <= MSTU[3]) K[4][I - 1] = K[2][K[4][I - 1] - 1] / MSTU[4];
                } else {
                    int KCM = (K[3][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    int KCD = K[3][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[3][I - 1] = MSTU[4] * MSTU[4] * (K[3][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                    KCM = (K[4][I - 1] / MSTU[4]) % MSTU[4];
                    if (KCM > 0 && KCM <= MSTU[3]) KCM = K[2][KCM - 1] / MSTU[4];
                    KCD = K[4][I - 1] % MSTU[4];
                    if (KCD > 0 && KCD <= MSTU[3]) KCD = K[2][KCD - 1] / MSTU[4];
                    K[4][I - 1] = MSTU[4] * MSTU[4] * (K[4][I - 1] / (MSTU[4] * MSTU[4])) + MSTU[4] * KCM + KCD;
                }
            }

            // Pack remaining entries. 
            I1 = 0;
            int MSTU90 = MSTU[89];
            MSTU[89] = 0;
            for (int I = 0; I < N; ++I) {
                if (K[2][I] / MSTU[4] == 0) continue;
                I1++;
                for (int J = 0; J < 5; ++J) {
                    K[J][I1 - 1] = K[J][I];
                    P[J][I1 - 1] = P[J][I];
                    V[J][I1 - 1] = V[J][I];
                }
                K[2][I1 - 1] = K[2][I1 - 1] % MSTU[4]; 
                for (int IZ = 0; IZ < MSTU90; ++IZ) {
                    if (I + 1 == MSTU[90 + IZ]) {
                        MSTU[89]++;
                        MSTU[89 + MSTU[89]] = I1;
                        PARU[89 + MSTU[89]] = PARU[90 + IZ];
                    }
                }
            }
            if (I1 < N) MSTU[2] = 0;
            if (I1 < N) MSTU[69] = 0;
            N = I1;

        // Fill in some missing daughter pointers (lost in colour flow). 
        } else if (MEDIT == 16) {
            for (int I = 1; I < N + 1; ++I) {
                if (K[0][I - 1] <= 10 || K[0][I - 1] > 20) continue;
                if (K[3][I - 1] != 0 || K[4][I - 1] != 0) continue;

                // Find daughters who point to mother.
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != I) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation version of mother.    
                int IM = K[2][I - 1];
                if (IM <= 0 || IM >= I) continue;
                if (K[0][IM - 1] <= 20 || K[0][IM - 1] > 30) continue;
                if (K[1][IM - 1] != K[1][I - 1] || std::abs(P[4][IM - 1] - P[4][I - 1]) > 1e-2) continue;
                for (int I1 = I + 1; I1 < N + 1; ++I1) {
                    if (K[2][I1 - 1] != IM) {
                        // do nothing
                    } else if (K[3][I - 1] == 0) {
                      K[3][I - 1] = I1;
                    } else {
                      K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
                if (K[3][I - 1] != 0) continue;

                // Find daughters who point to documentation daughters who,
                // in their turn, point to documentation mother.
                int ID1 = IM;
                int ID2 = IM;
                for (int I1 = IM + 1; I1 < I; ++I1) {
                    if (K[2][I1 - 1] == IM && K[0][I1 - 1] > 20 && K[0][I1 - 1] <= 30) {
                        ID2 = I1;
                        if (ID1 == IM) ID1 = I1;
                    }
                }
                for (int I1 = I + 1; I1 < N + 1; ++I) {
                    if (K[2][I1 - 1] != ID1 && K[2][I1 - 1] != ID2) {
                    } else if (K[3][I - 1] == 0) {
                        K[3][I - 1] = I1;
                    } else {
                        K[4][I - 1] = I1;
                    }
                }
                if (K[4][I - 1] == 0) K[4][I - 1] = K[3][I - 1];
            }

        // Save top entries at bottom of LUJETS common block.
        } else if (MEDIT == 21) {
            if (2 * N >= MSTU[3]) {
                LUERRM(11, "(LUEDIT:) no more memory left in LUJETS");
                return;
            }
            for (int I = 0; I < N; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][MSTU[3] - I] = K[J][I];
                    P[J][MSTU[3] - I] = P[J][I];
                    V[J][MSTU[3] - I] = V[J][I];
                }
            }
            MSTU[31] = N;

        // Restore bottom entries of common block LUJETS to top.
        } else if (MEDIT == 22) {
            for (int I = 0; I < MSTU[31]; ++I) {
                for (int J = 0; J < 5; ++J) {
                    K[J][I] = K[J][MSTU[3] - I];
                    P[J][I] = P[J][MSTU[3] - I];
                    V[J][I] = V[J][MSTU[3] - I];
                }
            }
            N = MSTU[31];

        // Mark primary entries at top of common block LUJETS as untreated.
        } else if (MEDIT == 23) {
            int I1 = 0;
            for (int I = 0; I < N; ++I) {
                int KH = K[2][I];
                if (KH >= 1) {
                    if (K[0][KH - 1] > 20) KH = 0;
                }
                if (KH != 0) break;
                I1++;
                if (K[0][I] > 10 && K[0][I] <= 20) K[0][I] -= 10;
            }
            N = I1;

        // Place largest axis along z axis and second largest in xy plane.
        } else if (MEDIT == 31 || MEDIT == 32) {
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60] - 1], P[1][MSTU[60] - 1]), 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], -ULANGL(P[2][MSTU[60] - 1], P[0][MSTU[60] - 1]), 0., 0., 0., 0.);
            LUDBRB(1, N + MSTU[2], 0., -ULANGL(P[0][MSTU[60]], P[0][MSTU[60]]), 0., 0., 0.);
            if (MEDIT == 31) return;
 
            // Rotate to put slim jet along +z axis. 
            for (int IS = 0; IS < 2; ++IS) {
                NS[IS] = 0;
                PTS[IS] = 0.;
                PLS[IS] = 0.;
            }
            for (int I = 0; I < N; ++I) {
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[2][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                NS[IS - 1]++;
                PTS[IS - 1] += std::sqrt(P[0][I] * P[0][I] + P[1][I] * P[1][I]);
            }
            if (NS[0] * PTS[1] * PTS[1] < NS[1] * PTS[0] * PTS[0]) LUDBRB(1, N + MSTU[2], PARU[0], 0., 0., 0., 0.);

            // Rotate to put second largest jet into -z,+x quadrant.
            for (int I = 0; I < N; ++I) {
                if (P[2][I] >= 0.) continue;
                if (K[0][I] <= 0 || K[0][I] > 10) continue;
                if (MSTU[40] >= 2) {
                    int KC = LUCOMP(K[1][I]);
                    if (KC == 0 || KC == 12 || KC == 14 || KC == 16 || KC == 18) continue;
                    if (MSTU[40] >= 3 && KCHG[1][KC - 1] == 0 && LUCHGE(K[1][I]) == 0) continue;
                }
                int IS = (P[0][I] < 0)? 2 : 1;  // this is the most meaningful expression I could derive from: int IS = 2. - SIGN(0.5, P[2][I])
                PLS[IS - 1] -= P[2][I];
            }
            if (PLS[1] > PLS[0]) LUDBRB(1, N + MSTU[2], 0., PARU[0], 0., 0., 0.);
      }
      return;
}